

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

QPolygonF * __thiscall QGraphicsView::mapToScene(QGraphicsView *this,QRect *rect)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  qint64 qVar3;
  reference pQVar4;
  undefined8 in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QRect *this_00;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  QPointF QVar8;
  QPointF QVar9;
  QPointF QVar10;
  QPointF QVar11;
  QGraphicsViewPrivate *d;
  QPolygonF *poly;
  QPointF bl;
  QPointF br;
  QPointF tr;
  QPointF tl;
  QRect r;
  QPointF scrollOffset;
  QTransform x;
  QGraphicsViewPrivate *p1;
  QGraphicsViewPrivate *pQVar12;
  QRect *in_stack_fffffffffffffea8;
  qreal local_100;
  qreal local_d8;
  qreal local_d0;
  qreal local_b0;
  qreal local_a8;
  qreal local_88;
  qreal local_80;
  QPointF local_68;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p1 = in_RDI;
  pQVar12 = in_RDI;
  pQVar2 = d_func((QGraphicsView *)0xa34422);
  bVar1 = QRect::isValid((QRect *)in_RDI);
  if (bVar1) {
    local_68.xp = -NAN;
    local_68.yp = -NAN;
    qVar3 = QGraphicsViewPrivate::horizontalScroll(in_RDI);
    this_00 = (QRect *)(double)qVar3;
    qVar3 = QGraphicsViewPrivate::verticalScroll(in_RDI);
    QPointF::QPointF(&local_68,(qreal)this_00,(double)qVar3);
    QRect::adjusted(in_stack_fffffffffffffea8,(int)((ulong)pQVar12 >> 0x20),(int)pQVar12,
                    (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    QRect::topLeft(this_00);
    QPointF::QPointF((QPointF *)in_RDI,(QPoint *)this_00);
    QVar8 = ::operator+((QPointF *)p1,(QPointF *)in_RDI);
    QRect::topRight(this_00);
    QPointF::QPointF((QPointF *)in_RDI,(QPoint *)this_00);
    QVar9 = ::operator+((QPointF *)p1,(QPointF *)in_RDI);
    QRect::bottomRight(this_00);
    QPointF::QPointF((QPointF *)in_RDI,(QPoint *)this_00);
    QVar10 = ::operator+((QPointF *)p1,(QPointF *)in_RDI);
    QRect::bottomLeft(this_00);
    QPointF::QPointF((QPointF *)in_RDI,(QPoint *)this_00);
    QVar11 = ::operator+((QPointF *)p1,(QPointF *)in_RDI);
    *(undefined1 **)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
         &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x8
         = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)
     &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.field_0x10
         = &DAT_aaaaaaaaaaaaaaaa;
    qVar6 = QVar11.yp;
    QPolygonF::QList((QPolygonF *)in_RDI,(qsizetype)this_00);
    if ((*(uint *)&pQVar2->field_0x300 >> 4 & 1) == 0) {
      memcpy(local_58,&DAT_00b47fe8,0x50);
      QTransform::inverted((bool *)local_58);
      qVar5 = (qreal)QTransform::map((QPointF *)local_58);
      qVar7 = qVar6;
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      pQVar4->xp = qVar5;
      pQVar4->yp = qVar6;
      qVar5 = (qreal)QTransform::map((QPointF *)local_58);
      qVar6 = qVar7;
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      pQVar4->xp = qVar5;
      pQVar4->yp = qVar7;
      qVar5 = (qreal)QTransform::map((QPointF *)local_58);
      qVar7 = qVar6;
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      pQVar4->xp = qVar5;
      pQVar4->yp = qVar6;
      qVar6 = (qreal)QTransform::map((QPointF *)local_58);
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      pQVar4->xp = qVar6;
      pQVar4->yp = qVar7;
    }
    else {
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      local_88 = QVar8.xp;
      pQVar4->xp = local_88;
      local_80 = QVar8.yp;
      pQVar4->yp = local_80;
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      local_b0 = QVar9.xp;
      pQVar4->xp = local_b0;
      local_a8 = QVar9.yp;
      pQVar4->yp = local_a8;
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      local_d8 = QVar10.xp;
      pQVar4->xp = local_d8;
      local_d0 = QVar10.yp;
      pQVar4->yp = local_d0;
      pQVar4 = QList<QPointF>::operator[]((QList<QPointF> *)in_RDI,(qsizetype)this_00);
      local_100 = QVar11.xp;
      pQVar4->xp = local_100;
      pQVar4->yp = QVar11.yp;
    }
  }
  else {
    memset(in_RDI,0,0x18);
    QPolygonF::QPolygonF((QPolygonF *)0xa34450);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPolygonF *)p1;
  }
  __stack_chk_fail();
}

Assistant:

QPolygonF QGraphicsView::mapToScene(const QRect &rect) const
{
    Q_D(const QGraphicsView);
    if (!rect.isValid())
        return QPolygonF();

    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    QRect r = rect.adjusted(0, 0, 1, 1);
    QPointF tl = scrollOffset + r.topLeft();
    QPointF tr = scrollOffset + r.topRight();
    QPointF br = scrollOffset + r.bottomRight();
    QPointF bl = scrollOffset + r.bottomLeft();

    QPolygonF poly(4);
    if (!d->identityMatrix) {
        QTransform x = d->matrix.inverted();
        poly[0] = x.map(tl);
        poly[1] = x.map(tr);
        poly[2] = x.map(br);
        poly[3] = x.map(bl);
    } else {
        poly[0] = tl;
        poly[1] = tr;
        poly[2] = br;
        poly[3] = bl;
    }
    return poly;
}